

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rabuilders_p.h
# Opt level: O2

Error __thiscall
asmjit::v1_14::RACFGBuilderT<asmjit::v1_14::x86::RACFGBuilder>::run
          (RACFGBuilderT<asmjit::v1_14::x86::RACFGBuilder> *this)

{
  uint uVar1;
  FuncNode *pFVar2;
  RABlock *pRVar3;
  RABlock *this_00;
  InstControlFlow IVar4;
  ulong uVar5;
  uint *puVar6;
  char cVar7;
  Error EVar8;
  RAWorkReg **ppRVar9;
  byte *pbVar10;
  RABlock *pRVar11;
  RABlock *pRVar12;
  byte bVar13;
  uint uVar14;
  long lVar15;
  InvokeNode *initialNode;
  InvokeNode *invokeNode;
  uint64_t uVar16;
  long lVar17;
  RATiedReg *tiedReg;
  uint *puVar18;
  RABlock **ppRVar19;
  int iVar20;
  int iVar21;
  InstControlFlow cf;
  LabelNode *labelNode;
  RABlock **local_10a0;
  ZoneVector<asmjit::v1_14::RABlock_*> blocksWithUnknownJumps;
  undefined4 local_1070;
  undefined8 local_106c;
  undefined8 uStack_1064;
  uint local_105c;
  Array<unsigned_int,_4UL> local_1058;
  Array<unsigned_int,_4UL> local_1048;
  uint *local_1038;
  uint local_1030 [3];
  byte local_1022 [4082];
  
  uVar5 = _blocksWithUnknownJumps;
  log<>(this,"[BuildCFG]\n");
  EVar8 = prepare(this);
  if (EVar8 == 0) {
    logNode(this,(BaseNode *)this->_funcNode,2,(char *)0x0);
    logBlock(this,this->_curBlock,2);
    pFVar2 = this->_funcNode;
    invokeNode = *(InvokeNode **)&pFVar2->field_0x8;
    if (invokeNode != (InvokeNode *)0x0) {
      pRVar3 = this->_curBlock;
      *(FuncNode **)(pRVar3 + 0x10) = pFVar2;
      *(FuncNode **)(pRVar3 + 0x18) = pFVar2;
      local_1070 = 0xffffffff;
      ppRVar19 = &this->_curBlock;
      local_106c = 0;
      uStack_1064 = 0;
      local_105c = 0;
      _blocksWithUnknownJumps = 0;
      Support::Array<unsigned_int,_4UL>::fill(&local_1058,(uint *)&blocksWithUnknownJumps);
      _blocksWithUnknownJumps = uVar5 & 0xffffffff00000000;
      Support::Array<unsigned_int,_4UL>::fill(&local_1048,(uint *)&blocksWithUnknownJumps);
      local_1038 = local_1030;
      _blocksWithUnknownJumps = 0;
      local_10a0 = ppRVar19;
LAB_00145f98:
      do {
        iVar20 = *(int *)&invokeNode->field_0x14;
        if (1 < iVar20 + 1U) {
          DebugUtils::assertionFailed
                    ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/x86/../x86/../core/rabuilders_p.h"
                     ,0x60,"node->position() == 0 || node->position() == kNodePositionDidOnBefore");
        }
        initialNode = *(InvokeNode **)&invokeNode->field_0x8;
        if ((invokeNode->field_0x11 & 0x20) == 0) {
          if (invokeNode->field_0x10 == '\x03') {
            pRVar11 = *ppRVar19;
            pRVar12 = *(RABlock **)&invokeNode->field_0x20;
            if (pRVar11 == (RABlock *)0x0) {
              *ppRVar19 = pRVar12;
              if (pRVar12 == (RABlock *)0x0) {
                pRVar12 = BaseRAPass::newBlock(this->_pass,(BaseNode *)invokeNode);
                this->_curBlock = pRVar12;
                if (pRVar12 == (RABlock *)0x0) {
                  return 1;
                }
                *(RABlock **)&invokeNode->field_0x20 = pRVar12;
                uVar14 = *(uint *)(pRVar12 + 0xc);
              }
              else {
                uVar14 = *(uint *)(pRVar12 + 0xc);
                if ((uVar14 & 1) != 0) goto LAB_001466c1;
              }
              *(uint *)(pRVar12 + 0xc) = uVar14 | 4;
              this->_hasCode = false;
              (this->_blockRegStats)._packed = 0;
              EVar8 = BaseRAPass::addBlock(this->_pass,pRVar12);
              if (EVar8 != 0) {
                return EVar8;
              }
              pRVar12 = *ppRVar19;
            }
            else if (pRVar12 == (RABlock *)0x0) {
              if ((pRVar11 == pRVar3 | this->_hasCode) == 1) {
                if (*(InvokeNode **)(pRVar11 + 0x18) == invokeNode) {
                  DebugUtils::assertionFailed
                            ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/x86/../x86/../core/rabuilders_p.h"
                             ,0x176,"_curBlock->last() != node");
                }
                *(undefined8 *)(pRVar11 + 0x18) = *(undefined8 *)invokeNode;
                *(uint *)(pRVar11 + 0xc) = *(uint *)(pRVar11 + 0xc) | 0x201;
                *(uint *)(pRVar11 + 0x30) =
                     *(uint *)(pRVar11 + 0x30) | (this->_blockRegStats)._packed;
                pRVar11 = BaseRAPass::newBlock(this->_pass,(BaseNode *)invokeNode);
                if (pRVar11 == (RABlock *)0x0) {
                  return 1;
                }
                pRVar11[0xc] = (RABlock)((byte)pRVar11[0xc] | 4);
                EVar8 = RABlock::appendSuccessor(*ppRVar19,pRVar11);
                if (EVar8 != 0) {
                  return EVar8;
                }
                EVar8 = BaseRAPass::addBlock(this->_pass,pRVar11);
                if (EVar8 != 0) {
                  return EVar8;
                }
                this->_curBlock = pRVar11;
                this->_hasCode = false;
                (this->_blockRegStats)._packed = 0;
              }
              *(RABlock **)&invokeNode->field_0x20 = pRVar11;
              pRVar12 = pRVar11;
            }
            else {
              pRVar12[0xc] = (RABlock)((byte)pRVar12[0xc] | 4);
              if (pRVar11 == pRVar12) {
                pRVar12 = pRVar11;
                if (this->_hasCode != false) break;
              }
              else {
                if (*(InvokeNode **)(pRVar11 + 0x18) == invokeNode) {
                  DebugUtils::assertionFailed
                            ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/x86/../x86/../core/rabuilders_p.h"
                             ,0x164,"_curBlock->last() != node");
                }
                *(undefined8 *)(pRVar11 + 0x18) = *(undefined8 *)invokeNode;
                *(uint *)(pRVar11 + 0xc) = *(uint *)(pRVar11 + 0xc) | 0x201;
                *(uint *)(pRVar11 + 0x30) =
                     *(uint *)(pRVar11 + 0x30) | (this->_blockRegStats)._packed;
                EVar8 = RABlock::appendSuccessor(pRVar11,pRVar12);
                if (EVar8 != 0) {
                  return EVar8;
                }
                EVar8 = BaseRAPass::addBlock(this->_pass,pRVar12);
                if (EVar8 != 0) {
                  return EVar8;
                }
                this->_curBlock = pRVar12;
                this->_hasCode = false;
                (this->_blockRegStats)._packed = 0;
              }
            }
            if ((pRVar12 != (RABlock *)0x0) && (pRVar12 != this->_lastLoggedBlock)) {
              logBlock(this,pRVar12,2);
            }
            logNode(this,(BaseNode *)invokeNode,2,(char *)0x0);
            if (*(uint32_t *)&invokeNode->field_0x30 == this->_exitLabelId) {
              pRVar11 = this->_curBlock;
              *(InvokeNode **)(pRVar11 + 0x18) = invokeNode;
              pRVar11[0xc] = (RABlock)((byte)pRVar11[0xc] | 1);
              *(uint *)(pRVar11 + 0x30) = *(uint *)(pRVar11 + 0x30) | (this->_blockRegStats)._packed
              ;
              EVar8 = BaseRAPass::addExitBlock(this->_pass,pRVar11);
LAB_00146373:
              if (EVar8 != 0) {
                return EVar8;
              }
LAB_001465c6:
              *ppRVar19 = (RABlock *)0x0;
            }
          }
          else {
            logNode(this,(BaseNode *)invokeNode,4,(char *)0x0);
            if (invokeNode->field_0x10 == '\n') {
              if (invokeNode == (InvokeNode *)this->_funcNode->_end) {
                if ((this->_curBlock == (RABlock *)0x0) || ((this->_hasCode & 1U) == 0))
                goto LAB_001466c1;
                break;
              }
            }
            else if ((invokeNode->field_0x10 == '\x10') &&
                    (invokeNode != (InvokeNode *)this->_funcNode)) break;
          }
        }
        else {
          if (*ppRVar19 == (RABlock *)0x0) {
            removeNode(this,(BaseNode *)invokeNode);
            invokeNode = initialNode;
            goto LAB_00145f98;
          }
          this->_hasCode = true;
          if (invokeNode->field_0x10 == '\x11') {
            if (iVar20 != -1) {
              lVar15 = *(long *)invokeNode;
              EVar8 = x86::RACFGBuilder::onBeforeRet((RACFGBuilder *)this,(FuncRetNode *)invokeNode)
              ;
              goto LAB_001460c8;
            }
LAB_00146120:
            *(undefined4 *)&invokeNode->field_0x14 = 0;
          }
          else if (invokeNode->field_0x10 == '\x12') {
            if (iVar20 == -1) goto LAB_00146120;
            lVar15 = *(long *)invokeNode;
            EVar8 = x86::RACFGBuilder::onBeforeInvoke((RACFGBuilder *)this,invokeNode);
LAB_001460c8:
            if (EVar8 != 0) {
              return EVar8;
            }
            if (lVar15 != *(long *)invokeNode) {
              if (*(InvokeNode **)(*local_10a0 + 0x10) == invokeNode) {
                *(undefined8 *)(*local_10a0 + 0x10) = *(undefined8 *)(lVar15 + 8);
              }
              *(undefined4 *)&invokeNode->field_0x14 = 0xffffffff;
              invokeNode = *(InvokeNode **)(lVar15 + 8);
              if ((invokeNode->field_0x11 & 0x20) == 0) {
                DebugUtils::assertionFailed
                          ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/x86/../x86/../core/rabuilders_p.h"
                           ,0x8c,"node->isInst()");
              }
            }
            initialNode = *(InvokeNode **)&invokeNode->field_0x8;
          }
          logNode(this,(BaseNode *)invokeNode,4,(char *)0x0);
          cf = kRegular;
          local_1070 = *(undefined4 *)(this->_curBlock + 8);
          local_105c = 0;
          local_106c = 0;
          uStack_1064 = 0;
          labelNode._0_4_ = 0;
          Support::Array<unsigned_int,_4UL>::fill(&local_1058,(uint *)&labelNode);
          labelNode._0_4_ = 0;
          Support::Array<unsigned_int,_4UL>::fill(&local_1048,(uint *)&labelNode);
          local_1038 = local_1030;
          EVar8 = x86::RACFGBuilder::onInst
                            ((RACFGBuilder *)this,(InstNode *)invokeNode,&cf,
                             (RAInstBuilder *)&local_1070);
          if (EVar8 != 0) {
            return EVar8;
          }
          cVar7 = invokeNode->field_0x10;
          if (cVar7 == '\x12') {
            EVar8 = x86::RACFGBuilder::onInvoke
                              ((RACFGBuilder *)this,invokeNode,(RAInstBuilder *)&local_1070);
            if (EVar8 != 0) {
              return EVar8;
            }
            cVar7 = invokeNode->field_0x10;
          }
          puVar6 = local_1038;
          if (cVar7 == '\x11') {
            EVar8 = x86::RACFGBuilder::onRet
                              ((RACFGBuilder *)this,(FuncRetNode *)invokeNode,
                               (RAInstBuilder *)&local_1070);
            if (EVar8 != 0) {
              return EVar8;
            }
            cf = kMaxValue;
          }
          else if (cf == kJump) {
            iVar20 = 0;
            for (puVar18 = local_1030; puVar18 != puVar6; puVar18 = puVar18 + 8) {
              ppRVar9 = ZoneVector<asmjit::v1_14::RAWorkReg_*>::operator[]
                                  (&this->_pass->_workRegs,(ulong)*puVar18);
              if (((byte)(*ppRVar9)[0x21] & 0xf) == 0) {
                bVar13 = *(byte *)((long)puVar18 + 0xe);
                iVar21 = iVar20;
                if (bVar13 == 0xff) {
                  iVar21 = iVar20 + 1;
                  labelNode._0_4_ = iVar20;
                  pbVar10 = Support::Array<unsigned_char,_2UL>::operator[]<unsigned_int>
                                      (&this->_pass->_scratchRegIndexes,(uint *)&labelNode);
                  bVar13 = *pbVar10;
                  *(byte *)((long)puVar18 + 0xe) = bVar13;
                }
                *(uint *)(*local_10a0 + 0xc0) = *(uint *)(*local_10a0 + 0xc0) | 1 << (bVar13 & 0x1f)
                ;
                iVar20 = iVar21;
              }
            }
          }
          EVar8 = BaseRAPass::assignRAInst
                            (this->_pass,(BaseNode *)invokeNode,this->_curBlock,
                             (RAInstBuilder *)&local_1070);
          ppRVar19 = local_10a0;
          IVar4 = cf;
          if (EVar8 != 0) {
            return EVar8;
          }
          uVar14 = (this->_blockRegStats)._packed | local_105c;
          (this->_blockRegStats)._packed = uVar14;
          if (cf != kRegular) {
            if (cf < kCall) {
              pRVar11 = *local_10a0;
              *(InvokeNode **)(pRVar11 + 0x18) = invokeNode;
              uVar1 = *(uint *)(pRVar11 + 0xc);
              *(uint *)(pRVar11 + 0xc) = uVar1 | 0x101;
              *(uint *)(pRVar11 + 0x30) = *(uint *)(pRVar11 + 0x30) | uVar14;
              if ((invokeNode->field_0x34 & 2) == 0) {
                if (invokeNode->field_0x12 == 0) break;
                lVar15 = (ulong)((byte)invokeNode->field_0x12 - 1) * 0x10;
                if ((*(uint *)(&invokeNode->field_0x40 + lVar15) & 7) == 5) {
                  EVar8 = BaseBuilder::labelNodeOf
                                    (&this->_cc->super_BaseBuilder,&labelNode,
                                     *(uint32_t *)(&invokeNode->field_0x44 + lVar15));
                  if (EVar8 != 0) {
                    return EVar8;
                  }
                  pRVar11 = BaseRAPass::newBlockOrExistingAt
                                      (this->_pass,
                                       (LabelNode *)CONCAT44(labelNode._4_4_,(int)labelNode),
                                       (BaseNode **)0x0);
                  if (pRVar11 == (RABlock *)0x0) {
                    return 1;
                  }
                  pRVar11[0xc] = (RABlock)((byte)pRVar11[0xc] | 4);
                  EVar8 = RABlock::appendSuccessor(*ppRVar19,pRVar11);
                }
                else {
                  *(uint *)(pRVar11 + 0xc) = uVar1 | 0x501;
                  if ((invokeNode->field_0x10 == '\x0f') &&
                     (lVar15 = *(long *)&invokeNode->_funcDetail, lVar15 != 0)) {
                    uVar16 = this->_pass->_lastTimestamp + 1;
                    this->_pass->_lastTimestamp = uVar16;
                    lVar17 = *(long *)(lVar15 + 0x10);
                    uVar14 = *(uint *)(lVar15 + 0x18);
                    for (lVar15 = 0; (ulong)uVar14 << 2 != lVar15; lVar15 = lVar15 + 4) {
                      EVar8 = BaseBuilder::labelNodeOf
                                        (&this->_cc->super_BaseBuilder,&labelNode,
                                         *(uint32_t *)(lVar17 + lVar15));
                      if (EVar8 != 0) {
                        return EVar8;
                      }
                      pRVar11 = BaseRAPass::newBlockOrExistingAt
                                          (this->_pass,
                                           (LabelNode *)CONCAT44(labelNode._4_4_,(int)labelNode),
                                           (BaseNode **)0x0);
                      if (pRVar11 == (RABlock *)0x0) {
                        return 1;
                      }
                      if (*(uint64_t *)(pRVar11 + 0x48) != uVar16) {
                        *(uint64_t *)(pRVar11 + 0x48) = uVar16;
                        pRVar11[0xc] = (RABlock)((byte)pRVar11[0xc] | 4);
                        EVar8 = RABlock::appendSuccessor(*local_10a0,pRVar11);
                        if (EVar8 != 0) {
                          return EVar8;
                        }
                      }
                    }
                    EVar8 = shareAssignmentAcrossSuccessors(this,this->_curBlock);
                    ppRVar19 = local_10a0;
                    if (EVar8 != 0) {
                      return EVar8;
                    }
                    goto LAB_001465c0;
                  }
                  EVar8 = ZoneVector<asmjit::v1_14::RABlock_*>::append
                                    (&blocksWithUnknownJumps,&this->_pass->_allocator,local_10a0);
                }
                if (EVar8 != 0) {
                  return EVar8;
                }
              }
LAB_001465c0:
              if (IVar4 == kJump) goto LAB_001465c6;
              if (initialNode == (InvokeNode *)0x0) break;
              if (initialNode->field_0x10 == '\x03') {
                pRVar11 = *(RABlock **)&initialNode->field_0x20;
                if (pRVar11 == (RABlock *)0x0) {
                  pRVar11 = BaseRAPass::newBlock(this->_pass,(BaseNode *)initialNode);
                  if (pRVar11 == (RABlock *)0x0) {
                    return 1;
                  }
                  *(RABlock **)&initialNode->field_0x20 = pRVar11;
                }
              }
              else {
                pRVar11 = BaseRAPass::newBlock(this->_pass,(BaseNode *)initialNode);
                if (pRVar11 == (RABlock *)0x0) {
                  return 1;
                }
              }
              this_00 = *ppRVar19;
              pRVar12 = this_00 + 0xc;
              *(uint *)pRVar12 = *(uint *)pRVar12 | 0x200;
              EVar8 = RABlock::prependSuccessor(this_00,pRVar11);
              if (EVar8 != 0) {
                return EVar8;
              }
              this->_curBlock = pRVar11;
              this->_hasCode = false;
              (this->_blockRegStats)._packed = 0;
              if (((byte)pRVar11[0xc] & 1) != 0) {
LAB_001466c1:
                lVar15 = _blocksWithUnknownJumps;
                if (this->_pass->_createdBlockCount == *(uint32_t *)&this->_pass->field_0xb8) {
                  for (lVar17 = 0; lVar17 != 0; lVar17 = lVar17 + 8) {
                    handleBlockWithUnknownJump(this,*(RABlock **)(lVar15 + lVar17));
                  }
                  EVar8 = BaseRAPass::initSharedAssignments
                                    (this->_pass,&this->_sharedAssignmentsMap);
                  return EVar8;
                }
                return 3;
              }
              EVar8 = BaseRAPass::addBlock(this->_pass,pRVar11);
              if (EVar8 != 0) {
                return EVar8;
              }
              logBlock(this,this->_curBlock,2);
              invokeNode = initialNode;
              goto LAB_00145f98;
            }
            if (cf == kMaxValue) {
              pRVar11 = this->_curBlock;
              *(InvokeNode **)(pRVar11 + 0x18) = invokeNode;
              pRVar11[0xc] = (RABlock)((byte)pRVar11[0xc] | 1);
              *(uint *)(pRVar11 + 0x30) = *(uint *)(pRVar11 + 0x30) | uVar14;
              EVar8 = RABlock::appendSuccessor(pRVar11,this->_retBlock);
              goto LAB_00146373;
            }
          }
        }
        invokeNode = initialNode;
      } while (initialNode != (InvokeNode *)0x0);
    }
    EVar8 = 3;
  }
  return EVar8;
}

Assistant:

Error run() noexcept {
    log("[BuildCFG]\n");
    ASMJIT_PROPAGATE(prepare());

    logNode(_funcNode, kRootIndentation);
    logBlock(_curBlock, kRootIndentation);

    RABlock* entryBlock = _curBlock;
    BaseNode* node = _funcNode->next();

    if (ASMJIT_UNLIKELY(!node)) {
      return DebugUtils::errored(kErrorInvalidState);
    }

    _curBlock->setFirst(_funcNode);
    _curBlock->setLast(_funcNode);

    RAInstBuilder ib;
    ZoneVector<RABlock*> blocksWithUnknownJumps;

    for (;;) {
      BaseNode* next = node->next();
      ASMJIT_ASSERT(node->position() == 0 || node->position() == kNodePositionDidOnBefore);

      if (node->isInst()) {
        // Instruction | Jump | Invoke | Return
        // ------------------------------------

        // Handle `InstNode`, `InvokeNode`, and `FuncRetNode`. All of them share the same interface that provides
        // operands that have read/write semantics.
        if (ASMJIT_UNLIKELY(!_curBlock)) {
          // Unreachable code has to be removed, we cannot allocate registers in such code as we cannot do proper
          // liveness analysis in such case.
          removeNode(node);
          node = next;
          continue;
        }

        _hasCode = true;

        if (node->isInvoke() || node->isFuncRet()) {
          if (node->position() != kNodePositionDidOnBefore) {
            // Call and Reg are complicated as they may insert some surrounding code around them. The simplest
            // approach is to get the previous node, call the `onBefore()` handlers and then check whether
            // anything changed and restart if so. By restart we mean that the current `node` would go back to
            // the first possible inserted node by `onBeforeInvoke()` or `onBeforeRet()`.
            BaseNode* prev = node->prev();

            if (node->type() == NodeType::kInvoke) {
              ASMJIT_PROPAGATE(static_cast<This*>(this)->onBeforeInvoke(node->as<InvokeNode>()));
            }
            else {
              ASMJIT_PROPAGATE(static_cast<This*>(this)->onBeforeRet(node->as<FuncRetNode>()));
            }

            if (prev != node->prev()) {
              // If this was the first node in the block and something was
              // inserted before it then we have to update the first block.
              if (_curBlock->first() == node) {
                _curBlock->setFirst(prev->next());
              }

              node->setPosition(kNodePositionDidOnBefore);
              node = prev->next();

              // `onBeforeInvoke()` and `onBeforeRet()` can only insert instructions.
              ASMJIT_ASSERT(node->isInst());
            }

            // Necessary if something was inserted after `node`, but nothing before.
            next = node->next();
          }
          else {
            // Change the position back to its original value.
            node->setPosition(0);
          }
        }

        InstNode* inst = node->as<InstNode>();
        logNode(inst, kCodeIndentation);

        InstControlFlow cf = InstControlFlow::kRegular;
        ib.reset(_curBlock->blockId());
        ASMJIT_PROPAGATE(static_cast<This*>(this)->onInst(inst, cf, ib));

        if (node->isInvoke()) {
          ASMJIT_PROPAGATE(static_cast<This*>(this)->onInvoke(inst->as<InvokeNode>(), ib));
        }

        if (node->isFuncRet()) {
          ASMJIT_PROPAGATE(static_cast<This*>(this)->onRet(inst->as<FuncRetNode>(), ib));
          cf = InstControlFlow::kReturn;
        }

        if (cf == InstControlFlow::kJump) {
          uint32_t fixedRegCount = 0;
          for (RATiedReg& tiedReg : ib) {
            RAWorkReg* workReg = _pass->workRegById(tiedReg.workId());
            if (workReg->group() == RegGroup::kGp) {
              uint32_t useId = tiedReg.useId();
              if (useId == BaseReg::kIdBad) {
                useId = _pass->_scratchRegIndexes[fixedRegCount++];
                tiedReg.setUseId(useId);
              }
              _curBlock->addExitScratchGpRegs(Support::bitMask(useId));
            }
          }
        }

        ASMJIT_PROPAGATE(_pass->assignRAInst(inst, _curBlock, ib));
        _blockRegStats.combineWith(ib._stats);

        if (cf != InstControlFlow::kRegular) {
          // Support for conditional and unconditional jumps.
          if (cf == InstControlFlow::kJump || cf == InstControlFlow::kBranch) {
            _curBlock->setLast(node);
            _curBlock->addFlags(RABlockFlags::kHasTerminator);
            _curBlock->makeConstructed(_blockRegStats);

            if (!inst->hasOption(InstOptions::kUnfollow)) {
              // Jmp/Jcc/Call/Loop/etc...
              uint32_t opCount = inst->opCount();
              const Operand* opArray = inst->operands();

              // Cannot jump anywhere without operands.
              if (ASMJIT_UNLIKELY(!opCount)) {
                return DebugUtils::errored(kErrorInvalidState);
              }

              if (opArray[opCount - 1].isLabel()) {
                // Labels are easy for constructing the control flow.
                LabelNode* labelNode;
                ASMJIT_PROPAGATE(cc()->labelNodeOf(&labelNode, opArray[opCount - 1].as<Label>()));

                RABlock* targetBlock = _pass->newBlockOrExistingAt(labelNode);
                if (ASMJIT_UNLIKELY(!targetBlock)) {
                  return DebugUtils::errored(kErrorOutOfMemory);
                }

                targetBlock->makeTargetable();
                ASMJIT_PROPAGATE(_curBlock->appendSuccessor(targetBlock));
              }
              else {
                // Not a label - could be jump with reg/mem operand, which means that it can go anywhere. Such jumps
                // must either be annotated so the CFG can be properly constructed, otherwise we assume the worst case
                // - can jump to any basic block.
                JumpAnnotation* jumpAnnotation = nullptr;
                _curBlock->addFlags(RABlockFlags::kHasJumpTable);

                if (inst->type() == NodeType::kJump) {
                  jumpAnnotation = inst->as<JumpNode>()->annotation();
                }

                if (jumpAnnotation) {
                  uint64_t timestamp = _pass->nextTimestamp();
                  for (uint32_t id : jumpAnnotation->labelIds()) {
                    LabelNode* labelNode;
                    ASMJIT_PROPAGATE(cc()->labelNodeOf(&labelNode, id));

                    RABlock* targetBlock = _pass->newBlockOrExistingAt(labelNode);
                    if (ASMJIT_UNLIKELY(!targetBlock)) {
                      return DebugUtils::errored(kErrorOutOfMemory);
                    }

                    // Prevents adding basic-block successors multiple times.
                    if (!targetBlock->hasTimestamp(timestamp)) {
                      targetBlock->setTimestamp(timestamp);
                      targetBlock->makeTargetable();
                      ASMJIT_PROPAGATE(_curBlock->appendSuccessor(targetBlock));
                    }
                  }
                  ASMJIT_PROPAGATE(shareAssignmentAcrossSuccessors(_curBlock));
                }
                else {
                  ASMJIT_PROPAGATE(blocksWithUnknownJumps.append(_pass->allocator(), _curBlock));
                }
              }
            }

            if (cf == InstControlFlow::kJump) {
              // Unconditional jump makes the code after the jump unreachable, which will be removed instantly during
              // the CFG construction; as we cannot allocate registers for instructions that are not part of any block.
              // Of course we can leave these instructions as they are, however, that would only postpone the problem
              // as assemblers can't encode instructions that use virtual registers.
              _curBlock = nullptr;
            }
            else {
              node = next;
              if (ASMJIT_UNLIKELY(!node))
                return DebugUtils::errored(kErrorInvalidState);

              RABlock* consecutiveBlock;
              if (node->type() == NodeType::kLabel) {
                if (node->hasPassData()) {
                  consecutiveBlock = node->passData<RABlock>();
                }
                else {
                  consecutiveBlock = _pass->newBlock(node);
                  if (ASMJIT_UNLIKELY(!consecutiveBlock)) {
                    return DebugUtils::errored(kErrorOutOfMemory);
                  }
                  node->setPassData<RABlock>(consecutiveBlock);
                }
              }
              else {
                consecutiveBlock = _pass->newBlock(node);
                if (ASMJIT_UNLIKELY(!consecutiveBlock)) {
                  return DebugUtils::errored(kErrorOutOfMemory);
                }
              }

              _curBlock->addFlags(RABlockFlags::kHasConsecutive);
              ASMJIT_PROPAGATE(_curBlock->prependSuccessor(consecutiveBlock));

              _curBlock = consecutiveBlock;
              _hasCode = false;
              _blockRegStats.reset();

              if (_curBlock->isConstructed())
                break;
              ASMJIT_PROPAGATE(_pass->addBlock(consecutiveBlock));

              logBlock(_curBlock, kRootIndentation);
              continue;
            }
          }

          if (cf == InstControlFlow::kReturn) {
            _curBlock->setLast(node);
            _curBlock->makeConstructed(_blockRegStats);
            ASMJIT_PROPAGATE(_curBlock->appendSuccessor(_retBlock));

            _curBlock = nullptr;
          }
        }
      }
      else if (node->type() == NodeType::kLabel) {
        // Label - Basic-Block Management
        // ------------------------------

        if (!_curBlock) {
          // If the current code is unreachable the label makes it reachable again. We may remove the whole block in
          // the future if it's not referenced though.
          _curBlock = node->passData<RABlock>();

          if (_curBlock) {
            // If the label has a block assigned we can either continue with it or skip it if the block has been
            // constructed already.
            if (_curBlock->isConstructed()) {
              break;
            }
          }
          else {
            // No block assigned - create a new one and assign it.
            _curBlock = _pass->newBlock(node);
            if (ASMJIT_UNLIKELY(!_curBlock)) {
              return DebugUtils::errored(kErrorOutOfMemory);
            }
            node->setPassData<RABlock>(_curBlock);
          }

          _curBlock->makeTargetable();
          _hasCode = false;
          _blockRegStats.reset();
          ASMJIT_PROPAGATE(_pass->addBlock(_curBlock));
        }
        else {
          if (node->hasPassData()) {
            RABlock* consecutive = node->passData<RABlock>();
            consecutive->makeTargetable();

            if (_curBlock == consecutive) {
              // The label currently processed is part of the current block. This is only possible for multiple labels
              // that are right next to each other or labels that are separated by non-code nodes like directives and
              // comments.
              if (ASMJIT_UNLIKELY(_hasCode)) {
                return DebugUtils::errored(kErrorInvalidState);
              }
            }
            else {
              // Label makes the current block constructed. There is a chance that the Label is not used, but we don't
              // know that at this point. In the worst case there would be two blocks next to each other, it's just fine.
              ASMJIT_ASSERT(_curBlock->last() != node);
              _curBlock->setLast(node->prev());
              _curBlock->addFlags(RABlockFlags::kHasConsecutive);
              _curBlock->makeConstructed(_blockRegStats);

              ASMJIT_PROPAGATE(_curBlock->appendSuccessor(consecutive));
              ASMJIT_PROPAGATE(_pass->addBlock(consecutive));

              _curBlock = consecutive;
              _hasCode = false;
              _blockRegStats.reset();
            }
          }
          else {
            // First time we see this label.
            if (_hasCode || _curBlock == entryBlock) {
              // Cannot continue the current block if it already contains some code or it's a block entry. We need to
              // create a new block and make it a successor.
              ASMJIT_ASSERT(_curBlock->last() != node);
              _curBlock->setLast(node->prev());
              _curBlock->addFlags(RABlockFlags::kHasConsecutive);
              _curBlock->makeConstructed(_blockRegStats);

              RABlock* consecutive = _pass->newBlock(node);
              if (ASMJIT_UNLIKELY(!consecutive)) {
                return DebugUtils::errored(kErrorOutOfMemory);
              }
              consecutive->makeTargetable();

              ASMJIT_PROPAGATE(_curBlock->appendSuccessor(consecutive));
              ASMJIT_PROPAGATE(_pass->addBlock(consecutive));

              _curBlock = consecutive;
              _hasCode = false;
              _blockRegStats.reset();
            }

            node->setPassData<RABlock>(_curBlock);
          }
        }

        if (_curBlock && _curBlock != _lastLoggedBlock) {
          logBlock(_curBlock, kRootIndentation);
        }
        logNode(node, kRootIndentation);

        // Unlikely: Assume that the exit label is reached only once per function.
        if (ASMJIT_UNLIKELY(node->as<LabelNode>()->labelId() == _exitLabelId)) {
          _curBlock->setLast(node);
          _curBlock->makeConstructed(_blockRegStats);
          ASMJIT_PROPAGATE(_pass->addExitBlock(_curBlock));

          _curBlock = nullptr;
        }
      }
      else {
        // Other Nodes | Function Exit
        // ---------------------------

        logNode(node, kCodeIndentation);

        if (node->type() == NodeType::kSentinel) {
          if (node == _funcNode->endNode()) {
            // Make sure we didn't flow here if this is the end of the function sentinel.
            if (ASMJIT_UNLIKELY(_curBlock && _hasCode))
              return DebugUtils::errored(kErrorInvalidState);
            break;
          }
        }
        else if (node->type() == NodeType::kFunc) {
          // RAPass can only compile a single function at a time. If we
          // encountered a function it must be the current one, bail if not.
          if (ASMJIT_UNLIKELY(node != _funcNode))
            return DebugUtils::errored(kErrorInvalidState);
          // PASS if this is the first node.
        }
        else {
          // PASS if this is a non-interesting or unknown node.
        }
      }

      // Advance to the next node.
      node = next;

      // NOTE: We cannot encounter a NULL node, because every function must be terminated by a sentinel (`stop`)
      // node. If we encountered a NULL node it means that something went wrong and this node list is corrupted;
      // bail in such case.
      if (ASMJIT_UNLIKELY(!node))
        return DebugUtils::errored(kErrorInvalidState);
    }

    if (_pass->hasDanglingBlocks())
      return DebugUtils::errored(kErrorInvalidState);

    for (RABlock* block : blocksWithUnknownJumps)
      handleBlockWithUnknownJump(block);

    return _pass->initSharedAssignments(_sharedAssignmentsMap);
  }